

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O2

string * __thiscall
util::logging::Msg::getMsg_txt_abi_cxx11_(string *__return_storage_ptr__,Msg *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->msg_txt);
  return __return_storage_ptr__;
}

Assistant:

std::string Msg::getMsg_txt() const
		{
			return msg_txt;
		}